

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O0

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::OldAt>::KDTree
          (void *param_1,undefined8 param_2,undefined8 param_3)

{
  double dVar1;
  pair<YaoMST::PointPair_*,_YaoMST::PointPair_*> pVar2;
  type *maxPoint;
  type *minPoint;
  int d;
  PointPair *in_stack_ffffffffffffff58;
  OldAt *this;
  PointPair *in_stack_ffffffffffffff70;
  PointPair *in_stack_ffffffffffffff78;
  PointPair *local_48;
  PointPair *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffcc;
  KDTree<YaoMST::PointPair,_2,_YaoMST::OldAt> *in_stack_ffffffffffffffd0;
  
  *(undefined8 *)param_1 = param_2;
  *(undefined8 *)((long)param_1 + 8) = param_3;
  std::allocator<int>::allocator((allocator<int> *)0x110c88);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)param_1,(size_type)in_stack_ffffffffffffff78,
             (allocator_type *)in_stack_ffffffffffffff70);
  std::allocator<int>::~allocator((allocator<int> *)0x110cab);
  build(in_stack_ffffffffffffffd0,
        (PointPair *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        in_stack_ffffffffffffffc0);
  pVar2.second = in_stack_ffffffffffffff70;
  pVar2.first = in_stack_ffffffffffffff78;
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    pVar2 = std::
            minmax_element<YaoMST::PointPair*,KDTree<YaoMST::PointPair,2,YaoMST::OldAt>::KDTree(YaoMST::PointPair*,YaoMST::PointPair*,YaoMST::OldAt)::_lambda(YaoMST::PointPair_const&,YaoMST::PointPair_const&)_1_>
                      (pVar2.first,pVar2.second,(anon_class_8_2_d5c7ce73_for__M_comp)param_1);
    local_48 = pVar2.first;
    this = (OldAt *)&local_48;
    std::get<0ul,YaoMST::PointPair*,YaoMST::PointPair*>
              ((pair<YaoMST::PointPair_*,_YaoMST::PointPair_*> *)0x110d2b);
    std::get<1ul,YaoMST::PointPair*,YaoMST::PointPair*>
              ((pair<YaoMST::PointPair_*,_YaoMST::PointPair_*> *)0x110d3a);
    dVar1 = YaoMST::OldAt::operator()(this,in_stack_ffffffffffffff58,0);
    *(double *)((long)param_1 + 0x30 + (long)iVar3 * 8) = dVar1;
    in_stack_ffffffffffffff58 =
         (PointPair *)YaoMST::OldAt::operator()(this,in_stack_ffffffffffffff58,0);
    *(PointPair **)((long)param_1 + 0x40 + (long)iVar3 * 8) = in_stack_ffffffffffffff58;
  }
  return;
}

Assistant:

KDTree(Point *first, Point *last, Coordinate coordinate = Coordinate())
			: first(first), last(last), coordinate(coordinate), split(last - first)
	{
		build(first, last);
		for (int d = 0; d < K; ++d)
		{
			auto[minPoint, maxPoint] = std::minmax_element(first, last, [=](const Point &lhs, const Point &rhs)
			{ return coordinate(lhs, d) < coordinate(rhs, d); });
			min[d] = coordinate(const_cast<const Point &>(*minPoint), d);
			max[d] = coordinate(const_cast<const Point &>(*maxPoint), d);
		}
	}